

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

bool __thiscall
cmServerProtocol::Activate
          (cmServerProtocol *this,cmServer *server,cmServerRequest *request,string *errorMessage)

{
  uint uVar1;
  Mode MStack_34;
  bool result;
  unique_ptr<cmake,_std::default_delete<cmake>_> local_30;
  string *local_28;
  string *errorMessage_local;
  cmServerRequest *request_local;
  cmServer *server_local;
  cmServerProtocol *this_local;
  
  local_28 = errorMessage;
  errorMessage_local = &request->Type;
  request_local = (cmServerRequest *)server;
  server_local = (cmServer *)this;
  if (server != (cmServer *)0x0) {
    this->m_Server = server;
    MStack_34 = Script;
    std::make_unique<cmake,cmake::Role,cmState::Mode>((Role *)&local_30,&stack0xffffffffffffffcc);
    std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator=(&this->m_CMakeInstance,&local_30)
    ;
    std::unique_ptr<cmake,_std::default_delete<cmake>_>::~unique_ptr(&local_30);
    uVar1 = (*this->_vptr_cmServerProtocol[5])(this,errorMessage_local,local_28);
    if ((uVar1 & 1) == 0) {
      std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator=
                (&this->m_CMakeInstance,(nullptr_t)0x0);
    }
    return (bool)((byte)uVar1 & 1);
  }
  __assert_fail("server",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServerProtocol.cxx"
                ,0x84,
                "bool cmServerProtocol::Activate(cmServer *, const cmServerRequest &, std::string *)"
               );
}

Assistant:

bool cmServerProtocol::Activate(cmServer* server,
                                const cmServerRequest& request,
                                std::string* errorMessage)
{
  assert(server);
  this->m_Server = server;
  this->m_CMakeInstance =
    cm::make_unique<cmake>(cmake::RoleProject, cmState::Project);
  const bool result = this->DoActivate(request, errorMessage);
  if (!result) {
    this->m_CMakeInstance = nullptr;
  }
  return result;
}